

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O1

bool __thiscall
ON_ReferencedComponentSettingsImpl::Internal_UpdateLayer
          (ON_ReferencedComponentSettingsImpl *this,ON_Layer *layer)

{
  int iVar1;
  ON_Layer *pOVar2;
  bool bVar3;
  ON_UUID *pOVar4;
  long lVar5;
  ON_UUID reference_file_layer_id;
  ON_UUID_struct local_38;
  
  pOVar4 = ON_ModelComponent::Id(&layer->super_ON_ModelComponent);
  local_38.Data1 = pOVar4->Data1;
  local_38.Data2 = pOVar4->Data2;
  local_38.Data3 = pOVar4->Data3;
  local_38.Data4 = *&pOVar4->Data4;
  bVar3 = ::operator==(&ON_nil_uuid,&local_38);
  if (!bVar3) {
    iVar1 = (this->m_layer_referenced_file_copy).m_count;
    if ((long)iVar1 < 1) {
      return false;
    }
    if (iVar1 != (this->m_layer_model_copy).m_count) {
      return false;
    }
    lVar5 = 0;
    do {
      pOVar2 = (this->m_layer_referenced_file_copy).m_a[lVar5];
      if (pOVar2 != (ON_Layer *)0x0) {
        pOVar4 = ON_ModelComponent::Id(&pOVar2->super_ON_ModelComponent);
        bVar3 = ::operator!=(&local_38,pOVar4);
        if ((!bVar3) && (pOVar2 = (this->m_layer_model_copy).m_a[lVar5], pOVar2 != (ON_Layer *)0x0))
        {
          Internal_UpdateLayer((this->m_layer_referenced_file_copy).m_a[lVar5],layer,pOVar2,layer);
          return true;
        }
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return false;
}

Assistant:

bool ON_ReferencedComponentSettingsImpl::Internal_UpdateLayer(
  ON_Layer& layer
  ) const
{
  for (;;)
  {
    // input layer has values read from reference file,
    // so layer->Id() = reference file layer id
    const ON_UUID reference_file_layer_id = layer.Id();
    if (ON_nil_uuid == reference_file_layer_id)
      break;

    const int count = m_layer_referenced_file_copy.Count();
    if (count <= 0)
      break;
    if (count != m_layer_model_copy.Count())
      break;
    for (int i = 0; i < count; i++)
    {
      if (nullptr == m_layer_referenced_file_copy[i])
        continue;
      if (reference_file_layer_id != m_layer_referenced_file_copy[i]->Id())
        continue;
      if (nullptr == m_layer_model_copy[i])
        continue;
      return ON_ReferencedComponentSettingsImpl::Internal_UpdateLayer(
        *m_layer_referenced_file_copy[i],
        layer,
        *m_layer_model_copy[i],
        layer
        );
    }
    break;
  }

  return false;
}